

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Index * sqlite3FindIndex(sqlite3 *db,char *zName,char *zDb)

{
  Schema *pSVar1;
  uint uVar2;
  int iVar3;
  Index *pIVar4;
  uint uVar5;
  
  uVar5 = 0;
  while( true ) {
    if (db->nDb <= (int)uVar5) {
      return (Index *)0x0;
    }
    uVar2 = uVar5 < 2 ^ uVar5;
    pSVar1 = db->aDb[uVar2].pSchema;
    if (((zDb == (char *)0x0) || (iVar3 = sqlite3StrICmp(zDb,db->aDb[uVar2].zDbSName), iVar3 == 0))
       && (pIVar4 = (Index *)sqlite3HashFind(&pSVar1->idxHash,zName), pIVar4 != (Index *)0x0))
    break;
    uVar5 = uVar5 + 1;
  }
  return pIVar4;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3FindIndex(sqlite3 *db, const char *zName, const char *zDb){
  Index *p = 0;
  int i;
  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDb!=0 || sqlite3BtreeHoldsAllMutexes(db) );
  for(i=OMIT_TEMPDB; i<db->nDb; i++){
    int j = (i<2) ? i^1 : i;  /* Search TEMP before MAIN */
    Schema *pSchema = db->aDb[j].pSchema;
    assert( pSchema );
    if( zDb && sqlite3StrICmp(zDb, db->aDb[j].zDbSName) ) continue;
    assert( sqlite3SchemaMutexHeld(db, j, 0) );
    p = sqlite3HashFind(&pSchema->idxHash, zName);
    if( p ) break;
  }
  return p;
}